

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O1

bool __thiscall ParsedH266TrackData::spsppsExists(ParsedH266TrackData *this,uint8_t *buff,int size)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint32_t *cur32;
  uint32_t *puVar5;
  byte bVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  
  uVar4 = (ulong)(this->super_ParsedH264TrackData).m_nalSize;
  if (buff < buff + ((long)size - uVar4)) {
    bVar6 = 0;
    bVar8 = 0;
    bVar9 = 0;
    puVar5 = (uint32_t *)buff;
    do {
      if ((char)uVar4 == '\x04') {
        uVar3 = my_ntohl(*puVar5);
      }
      else {
        uVar3 = (uint)*(byte *)((long)puVar5 + 2) |
                (uint)*(byte *)((long)puVar5 + 1) << 8 | (uint)(byte)*puVar5 << 0x10;
      }
      bVar1 = (this->super_ParsedH264TrackData).m_nalSize;
      bVar2 = *(byte *)((ulong)bVar1 + 1 + (long)puVar5) >> 3;
      if (bVar2 == 0xe) {
        bVar6 = 1;
      }
      else if (bVar2 == 0x10) {
        bVar8 = 1;
      }
      else if (bVar2 == 0xf) {
        bVar9 = 1;
      }
      puVar5 = (uint32_t *)((long)puVar5 + (ulong)(uVar3 + bVar1));
      uVar4 = (ulong)(this->super_ParsedH264TrackData).m_nalSize;
    } while (puVar5 < buff + ((long)size - uVar4));
    bVar7 = (bool)(bVar6 & bVar9 & bVar8);
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ParsedH266TrackData::spsppsExists(uint8_t* buff, const int size)
{
    uint8_t* curPos = buff;
    const uint8_t* end = buff + size;
    bool vpsFound = false;
    bool spsFound = false;
    bool ppsFound = false;
    while (curPos < end - m_nalSize)
    {
        uint32_t elSize;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        const auto nalUnitType = static_cast<VvcUnit::NalType>(curPos[m_nalSize + 1] >> 3);
        if (nalUnitType == VvcUnit::NalType::VPS)
            vpsFound = true;
        else if (nalUnitType == VvcUnit::NalType::SPS)
            spsFound = true;
        else if (nalUnitType == VvcUnit::NalType::PPS)
            ppsFound = true;
        curPos += elSize + m_nalSize;
    }
    return vpsFound && spsFound && ppsFound;
}